

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int set_field_buffer(FIELD *field,int buffer,char *value)

{
  int iVar1;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  size_t sVar6;
  ushort **ppuVar7;
  char *pcVar8;
  int syncres;
  int off;
  uint i_1;
  uint vlen;
  uint i;
  char *v;
  uint len;
  int res;
  char *p;
  char *s;
  char *value_local;
  int buffer_local;
  FIELD *field_local;
  
  v._4_4_ = 0;
  if ((((field == (FIELD *)0x0) || (value == (char *)0x0)) || (buffer < 0)) ||
     (field->nbuf < buffer)) {
    piVar5 = __errno_location();
    *piVar5 = -2;
    field_local._4_4_ = -2;
  }
  else {
    syncres = field->drows * field->dcols;
    if (buffer == 0) {
      i_1 = 0;
      for (_vlen = (byte *)value; *_vlen != 0 && i_1 < (uint)syncres; _vlen = _vlen + 1) {
        ppuVar7 = __ctype_b_loc();
        if (((*ppuVar7)[(int)(uint)*_vlen] & 0x4000) == 0) {
          piVar5 = __errno_location();
          *piVar5 = -2;
          return -2;
        }
        i_1 = i_1 + 1;
      }
    }
    v._0_4_ = syncres;
    if ((field->status & 8) != 0) {
      sVar6 = strlen(value);
      uVar3 = (uint)sVar6;
      v._0_4_ = syncres;
      if ((uint)syncres < uVar3) {
        _Var2 = Field_Grown(field,(uVar3 - syncres) /
                                  (uint)(((int)field->rows + field->nrow) * (int)field->cols) + 1);
        if (!_Var2) {
          piVar5 = __errno_location();
          *piVar5 = -1;
          return -1;
        }
        v._0_4_ = uVar3;
        if (buffer == 0) {
          for (; (uint)syncres < uVar3; syncres = syncres + 1) {
            ppuVar7 = __ctype_b_loc();
            if (((*ppuVar7)[(int)value[(uint)syncres]] & 0x4000) == 0) {
              piVar5 = __errno_location();
              *piVar5 = -2;
              return -2;
            }
          }
        }
      }
    }
    pcVar8 = field->buf + buffer * (field->drows * field->dcols + 1);
    for (p = value; *p != '\0' && p < value + (uint)v; p = p + 1) {
      pcVar8[(long)p - (long)value] = *p;
    }
    if (p < value + (uint)v) {
      pcVar8[(int)p - (int)value] = *p;
      p = pcVar8 + (long)(p + (1 - (long)value));
    }
    else {
      p = (char *)0x0;
    }
    if (p != (char *)0x0) {
      iVar1 = (int)pcVar8;
      iVar4 = (int)(p + -1);
      if ((uint)v < (uint)(iVar4 - iVar1)) {
        __assert_fail("len >= (unsigned int)(s-p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CursesDialog/form/frm_driver.c"
                      ,0xf09,"int set_field_buffer(FIELD *, int, const char *)");
      }
      if ((uint)(iVar4 - iVar1) < (uint)v) {
        memset(p + -1,0x20,(ulong)((uint)v - (iVar4 - iVar1)));
      }
    }
    if (buffer == 0) {
      iVar4 = Synchronize_Field(field);
      if (iVar4 != 0) {
        v._4_4_ = iVar4;
      }
      iVar4 = Synchronize_Linked_Fields(field);
      if ((iVar4 != 0) && (v._4_4_ == 0)) {
        v._4_4_ = iVar4;
      }
    }
    piVar5 = __errno_location();
    *piVar5 = v._4_4_;
    field_local._4_4_ = v._4_4_;
  }
  return field_local._4_4_;
}

Assistant:

int set_field_buffer(FIELD * field, int buffer, const char * value)
{
  char *s, *p;
  int res = E_OK;
  unsigned int len;

  if ( !field || !value || ((buffer < 0)||(buffer > field->nbuf)) )
    RETURN(E_BAD_ARGUMENT);

  len  = Buffer_Length(field);

  if (buffer==0)
    {
      const char *v;
      unsigned int i = 0;

      for(v=value; *v && (i<len); v++,i++)
        {
          if (!isprint((unsigned char)*v))
            RETURN(E_BAD_ARGUMENT);
        }
    }

  if (Growable(field))
    {
      /* for a growable field we must assume zero terminated strings, because
         somehow we have to detect the length of what should be copied.
      */
      unsigned int vlen = strlen(value);
      if (vlen > len)
        {
          if (!Field_Grown(field,
                           (int)(1 + (vlen-len)/((field->rows+field->nrow)*field->cols))))
            RETURN(E_SYSTEM_ERROR);

          /* in this case we also have to check, whether or not the remaining
             characters in value are also printable for buffer 0. */
          if (buffer==0)
            {
              unsigned int i;
          
              for(i=len; i<vlen; i++)
                if (!isprint((int)(value[i])))
                  RETURN(E_BAD_ARGUMENT);
            }
          len = vlen;
        }
    }
  
  p   = Address_Of_Nth_Buffer(field,buffer);

#if HAVE_MEMCCPY
  s = memccpy(p,value,0,len);
#else
  for(s=(char *)value; *s && (s < (value+len)); s++)
    p[s-value] = *s;
  if (s < (value+len))
    {
      int off = s-value;
      p[off] = *s++;
      s = p + (s-value);
    }
  else 
    s=(char *)0;
#endif

  if (s) 
    { /* this means, value was null terminated and not greater than the
         buffer. We have to pad with blanks. Please note that due to memccpy
         logic s points after the terminating null. */
      s--; /* now we point to the terminator. */
      assert(len >= (unsigned int)(s-p));
      if (len > (unsigned int)(s-p))
        memset(s,C_BLANK,len-(unsigned int)(s-p));
    }

  if (buffer==0)
    {
      int syncres;
      if (((syncres=Synchronize_Field( field ))!=E_OK) && 
          (res==E_OK))
        res = syncres;
      if (((syncres=Synchronize_Linked_Fields(field ))!=E_OK) &&
          (res==E_OK))
        res = syncres;
    }
  RETURN(res);
}